

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_line.c
# Opt level: O3

int dwarf_srclines_files_indexes
              (Dwarf_Line_Context line_context,Dwarf_Signed *baseindex,Dwarf_Signed *file_count,
              Dwarf_Signed *endindex,Dwarf_Error *error)

{
  Dwarf_Unsigned DVar1;
  Dwarf_Unsigned DVar2;
  char *msg;
  Dwarf_Signed errval;
  Dwarf_Debug dbg;
  
  if (line_context->lc_magic != 0xd00d1111) {
    _dwarf_error((Dwarf_Debug)0x0,error,0x131);
    return 1;
  }
  if ((long)line_context->lc_file_entry_baseindex < 0) {
    dbg = line_context->lc_dbg;
    msg = 
    "DW_DLE_LINE_INDEX_WRONG Call to dwarf_srclines_subprog_data finds an Impossible file entry index value"
    ;
  }
  else {
    DVar1 = line_context->lc_file_entry_count;
    if ((long)DVar1 < 0) {
      dbg = line_context->lc_dbg;
      msg = 
      "DW_DLE_LINE_COUNT_WRONG Call to dwarf_srclines_subprog_data finds an Impossible file count index value"
      ;
      errval = 500;
      goto LAB_0016a8be;
    }
    DVar2 = line_context->lc_file_entry_endindex;
    if (-1 < (long)DVar2) {
      *baseindex = line_context->lc_file_entry_baseindex;
      *file_count = DVar1;
      *endindex = DVar2;
      return 0;
    }
    dbg = line_context->lc_dbg;
    msg = 
    "DW_DLE_LINE_INDEX_WRONG Call to dwarf_srclines_subprog_data finds an Impossible endindex value"
    ;
  }
  errval = 499;
LAB_0016a8be:
  _dwarf_error_string(dbg,error,errval,msg);
  return 1;
}

Assistant:

int
dwarf_srclines_files_indexes(Dwarf_Line_Context line_context,
    Dwarf_Signed   *baseindex,
    Dwarf_Signed   *file_count,
    Dwarf_Signed   *endindex,
    Dwarf_Error    * error)
{
    if (line_context->lc_magic != DW_CONTEXT_MAGIC) {
        _dwarf_error(NULL, error, DW_DLE_LINE_CONTEXT_BOTCH);
        return DW_DLV_ERROR;
    }
    {
        Dwarf_Signed bi =
            (Dwarf_Signed)line_context->lc_file_entry_baseindex;
        Dwarf_Signed fc =
            (Dwarf_Signed)line_context->lc_file_entry_count;
        Dwarf_Signed ei =
            (Dwarf_Signed)line_context->lc_file_entry_endindex;
        if (bi < 0) {
            _dwarf_error_string(line_context->lc_dbg,error,
                DW_DLE_LINE_INDEX_WRONG,
                "DW_DLE_LINE_INDEX_WRONG "
                "Call to dwarf_srclines_subprog_data "
                "finds an Impossible "
                "file entry index value");
            return DW_DLV_ERROR;
        }
        if (fc < 0) {
            _dwarf_error_string(line_context->lc_dbg,error,
                DW_DLE_LINE_COUNT_WRONG,
                "DW_DLE_LINE_COUNT_WRONG "
                "Call to dwarf_srclines_subprog_data "
                "finds an Impossible "
                "file count index value");
            return DW_DLV_ERROR;
        }
        if (ei < 0) {
            _dwarf_error_string(line_context->lc_dbg,error,
                DW_DLE_LINE_INDEX_WRONG,
                "DW_DLE_LINE_INDEX_WRONG "
                "Call to dwarf_srclines_subprog_data "
                "finds an Impossible "
                "endindex value");
            return DW_DLV_ERROR;
        }
        *baseindex  = bi;
        *file_count = fc;
        *endindex   = ei;
    }
    return DW_DLV_OK;
}